

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_user.cpp
# Opt level: O3

void __thiscall
Parser_parseInvalidXmlDirectlyUsingLibxml_Test::~Parser_parseInvalidXmlDirectlyUsingLibxml_Test
          (Parser_parseInvalidXmlDirectlyUsingLibxml_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, parseInvalidXmlDirectlyUsingLibxml)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\"><component></model>";

    // parse the string using libcellml
    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(e);
    EXPECT_NE(size_t(0), parser->issueCount());

    // and now parse directly using libxml2
    xmlInitParser();
    xmlParserCtxtPtr context = xmlNewParserCtxt();
    xmlSetStructuredErrorFunc(context, structuredErrorCallback);
    xmlDocPtr doc = xmlCtxtReadDoc(context, reinterpret_cast<const xmlChar *>(e.c_str()), "/", nullptr, 0);
    xmlFreeParserCtxt(context);
    xmlSetStructuredErrorFunc(nullptr, nullptr);
    xmlCleanupParser();

    EXPECT_EQ(nullptr, doc);
}